

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int nn_pipebase_start(nn_pipebase *self)

{
  nn_sock *in_RDI;
  int rc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  if (*(char *)&in_RDI->sockbase != '\x01') {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(byte *)&in_RDI->sockbase,
            "NN_PIPEBASE_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/pipe.c"
            ,0x4f);
    fflush(_stderr);
    nn_err_abort();
  }
  *(undefined1 *)&in_RDI->sockbase = 2;
  *(undefined1 *)((long)&in_RDI->sockbase + 1) = 4;
  *(undefined1 *)((long)&in_RDI->sockbase + 2) = 1;
  local_4 = nn_sock_add(in_RDI,(nn_pipe *)
                               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (local_4 < 0) {
    *(undefined1 *)&in_RDI->sockbase = 3;
  }
  else {
    nn_fsm_raise(&in_RDI->fsm,(nn_fsm_event *)CONCAT44(local_4,in_stack_ffffffffffffffe8),0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_pipebase_start (struct nn_pipebase *self)
{
    int rc;

    nn_assert_state (self, NN_PIPEBASE_STATE_IDLE);

    self->state = NN_PIPEBASE_STATE_ACTIVE;
    self->instate = NN_PIPEBASE_INSTATE_ASYNC;
    self->outstate = NN_PIPEBASE_OUTSTATE_IDLE;
    rc = nn_sock_add (self->sock, (struct nn_pipe*) self);
    if (nn_slow (rc < 0)) {
        self->state = NN_PIPEBASE_STATE_FAILED;
        return rc;
    }
    nn_fsm_raise (&self->fsm, &self->out, NN_PIPE_OUT);

    return 0;
}